

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O3

int Ivy_ManCleanupSeq(Ivy_Man_t *p)

{
  undefined1 *puVar1;
  uint uVar2;
  Ivy_Obj_t *pIVar3;
  long lVar4;
  long lVar5;
  uint *puVar6;
  void *pvVar7;
  Vec_Ptr_t *pVVar8;
  void *pvVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  
  puVar1 = &p->pConst1->field_0x8;
  *(uint *)puVar1 = *(uint *)puVar1 | 0x10;
  pVVar8 = p->vPis;
  if (0 < pVVar8->nSize) {
    lVar5 = 0;
    do {
      puVar6 = (uint *)((long)pVVar8->pArray[lVar5] + 8);
      *puVar6 = *puVar6 | 0x10;
      lVar5 = lVar5 + 1;
      pVVar8 = p->vPis;
    } while (lVar5 < pVVar8->nSize);
  }
  pVVar8 = p->vPos;
  if (0 < pVVar8->nSize) {
    lVar5 = 0;
    do {
      Ivy_ManCleanupSeq_rec((Ivy_Obj_t *)pVVar8->pArray[lVar5]);
      lVar5 = lVar5 + 1;
      pVVar8 = p->vPos;
    } while (lVar5 < pVVar8->nSize);
  }
  puVar6 = (uint *)malloc(0x10);
  puVar6[1] = 0;
  pvVar7 = malloc(800);
  *(void **)(puVar6 + 2) = pvVar7;
  pVVar8 = p->vObjs;
  if (pVVar8->nSize < 1) {
LAB_007a86df:
    pvVar7 = *(void **)(puVar6 + 2);
    iVar11 = 0;
LAB_007a86e6:
    if (pvVar7 == (void *)0x0) goto LAB_007a86f3;
  }
  else {
    uVar14 = 0;
    uVar12 = 100;
    lVar5 = 0;
    do {
      pvVar7 = pVVar8->pArray[lVar5];
      if (pvVar7 != (void *)0x0) {
        if ((*(uint *)((long)pvVar7 + 8) & 0x10) == 0) {
          iVar13 = (int)uVar14;
          iVar11 = (int)uVar12;
          if (iVar13 == iVar11) {
            if (iVar11 < 0x10) {
              if (*(void **)(puVar6 + 2) == (void *)0x0) {
                pvVar9 = malloc(0x80);
              }
              else {
                pvVar9 = realloc(*(void **)(puVar6 + 2),0x80);
              }
              *(void **)(puVar6 + 2) = pvVar9;
              *puVar6 = 0x10;
              uVar12 = 0x10;
            }
            else {
              uVar12 = (ulong)(uint)(iVar11 * 2);
              if (*(void **)(puVar6 + 2) == (void *)0x0) {
                pvVar9 = malloc(uVar12 * 8);
              }
              else {
                pvVar9 = realloc(*(void **)(puVar6 + 2),uVar12 * 8);
              }
              *(void **)(puVar6 + 2) = pvVar9;
              *puVar6 = iVar11 * 2;
            }
          }
          else {
            pvVar9 = *(void **)(puVar6 + 2);
          }
          uVar14 = (ulong)(iVar13 + 1);
          *(void **)((long)pvVar9 + (long)iVar13 * 8) = pvVar7;
        }
        else {
          *(uint *)((long)pvVar7 + 8) = *(uint *)((long)pvVar7 + 8) & 0xffffffef;
        }
      }
      iVar11 = (int)uVar14;
      lVar5 = lVar5 + 1;
      pVVar8 = p->vObjs;
    } while (lVar5 < pVVar8->nSize);
    if (iVar11 == 0) goto LAB_007a86df;
    pvVar7 = *(void **)(puVar6 + 2);
    if (iVar11 < 1) goto LAB_007a86e6;
    uVar12 = 0;
    do {
      Ivy_ObjDisconnect(p,*(Ivy_Obj_t **)((long)pvVar7 + uVar12 * 8));
      uVar12 = uVar12 + 1;
    } while (uVar14 != uVar12);
    if (0 < iVar11) {
      uVar12 = 0;
      do {
        pIVar3 = *(Ivy_Obj_t **)((long)pvVar7 + uVar12 * 8);
        if ((*(uint *)&pIVar3->field_0x8 & 0xc) != 4) {
          __assert_fail("Ivy_ObjIsNode(pObj) || Ivy_ObjIsLatch(pObj) || Ivy_ObjIsBuf(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyMan.c"
                        ,0x158,"int Ivy_ManCleanupSeq(Ivy_Man_t *)");
        }
        if (pIVar3->nRefs != 0) {
          __assert_fail("Ivy_ObjRefs(pObj) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyMan.c"
                        ,0x159,"int Ivy_ManCleanupSeq(Ivy_Man_t *)");
        }
        p->nObjs[*(uint *)&pIVar3->field_0x8 & 0xf] =
             p->nObjs[*(uint *)&pIVar3->field_0x8 & 0xf] + -1;
        p->nDeleted = p->nDeleted + 1;
        if ((p->fFanout != 0) && ((*(uint *)&pIVar3->field_0x8 & 0xf) == 7)) {
          pVVar8 = p->vBufs;
          uVar2 = pVVar8->nSize;
          lVar5 = (ulong)uVar2 + 1;
          do {
            if ((int)lVar5 + -1 < 1) {
              __assert_fail("i >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
            }
            lVar10 = lVar5 + -1;
            lVar4 = lVar5 + -2;
            lVar5 = lVar10;
          } while ((Ivy_Obj_t *)pVVar8->pArray[lVar4] != pIVar3);
          for (; (int)lVar10 < (int)uVar2; lVar10 = lVar10 + 1) {
            pVVar8->pArray[lVar10 + -1] = pVVar8->pArray[lVar10];
          }
          pVVar8->nSize = uVar2 - 1;
        }
        iVar13 = pIVar3->Id;
        if (((long)iVar13 < 0) || (p->vObjs->nSize <= iVar13)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        p->vObjs->pArray[iVar13] = (void *)0x0;
        pIVar3->field_0x8 = pIVar3->field_0x8 & 0xf0;
        *(Ivy_Obj_t **)pIVar3 = p->pListFree;
        p->pListFree = pIVar3;
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar14);
      goto LAB_007a86e6;
    }
  }
  free(pvVar7);
LAB_007a86f3:
  free(puVar6);
  return iVar11;
}

Assistant:

int Ivy_ManCleanupSeq( Ivy_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Ivy_Obj_t * pObj;
    int i, RetValue;
    // mark the constant and PIs
    Ivy_ObjSetMarkA( Ivy_ManConst1(p) );
    Ivy_ManForEachPi( p, pObj, i )
        Ivy_ObjSetMarkA( pObj );
    // mark nodes visited from POs
    Ivy_ManForEachPo( p, pObj, i )
        Ivy_ManCleanupSeq_rec( pObj );
    // collect unmarked nodes
    vNodes = Vec_PtrAlloc( 100 );
    Ivy_ManForEachObj( p, pObj, i )
    {
        if ( Ivy_ObjIsMarkA(pObj) )
            Ivy_ObjClearMarkA(pObj);
        else
            Vec_PtrPush( vNodes, pObj );
    }
    if ( Vec_PtrSize(vNodes) == 0 )
    {
        Vec_PtrFree( vNodes );
//printf( "Sequential sweep cleaned out %d nodes.\n", 0 );
        return 0;
    }
    // disconnect the marked objects
    Vec_PtrForEachEntry( Ivy_Obj_t *, vNodes, pObj, i )
        Ivy_ObjDisconnect( p, pObj );
    // remove the dangling objects
    Vec_PtrForEachEntry( Ivy_Obj_t *, vNodes, pObj, i )
    {
        assert( Ivy_ObjIsNode(pObj) || Ivy_ObjIsLatch(pObj) || Ivy_ObjIsBuf(pObj) );
        assert( Ivy_ObjRefs(pObj) == 0 );
        // update node counters of the manager
        p->nObjs[pObj->Type]--;
        p->nDeleted++;
        // delete buffer from the array of buffers
        if ( p->fFanout && Ivy_ObjIsBuf(pObj) )
            Vec_PtrRemove( p->vBufs, pObj );
        // free the node
        Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
        Ivy_ManRecycleMemory( p, pObj );
    }
    // return the number of nodes freed
    RetValue = Vec_PtrSize(vNodes);
    Vec_PtrFree( vNodes );
//printf( "Sequential sweep cleaned out %d nodes.\n", RetValue );
    return RetValue;
}